

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_all_resolve_element
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue errors;
  int iVar3;
  int iVar4;
  ulong uVar5;
  JSAtom prop;
  ulong uVar6;
  int64_t iVar7;
  char *str;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  int index;
  JSValueUnion local_80;
  int64_t local_78;
  JSValue *local_70;
  JSValue values;
  JSValue local_40;
  
  local_70 = argv;
  iVar3 = JS_ToBool(ctx,*func_data);
  values.u = func_data[2].u;
  values.tag = func_data[2].tag;
  JVar1 = (JSValueUnion)func_data[3].u.ptr;
  iVar2 = func_data[3].tag;
  JVar10 = func_data[4];
  iVar4 = JS_ToInt32(ctx,&index,func_data[1]);
  iVar7 = 6;
  if (iVar4 != 0) {
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_0013e125;
  }
  if (iVar3 != 0) {
    uVar5 = 0;
    uVar6 = 0;
    iVar7 = 3;
    goto LAB_0013e125;
  }
  (func_data->u).float64 = 4.94065645841247e-324;
  func_data->tag = 1;
  local_80 = JVar1;
  local_78 = iVar2;
  if ((magic & 3U) == 1) {
    JVar8 = JS_NewObject(ctx);
    if ((int)JVar8.tag != 6) {
      str = "rejected";
      if ((magic & 4U) == 0) {
        str = "fulfilled";
      }
      JVar9 = JS_NewString(ctx,str);
      if (((int)JVar9.tag != 6) &&
         (iVar3 = JS_DefinePropertyValue(ctx,JVar8,0x88,JVar9,7), -1 < iVar3)) {
        prop = 0x89;
        if ((magic & 4U) == 0) {
          prop = 0x40;
        }
        JVar9 = *local_70;
        if (0xfffffff4 < (uint)local_70->tag) {
          *(int *)(local_70->u).ptr = *(local_70->u).ptr + 1;
        }
        iVar3 = JS_DefinePropertyValue(ctx,JVar8,prop,JVar9,7);
        if (-1 < iVar3) goto LAB_0013e05f;
      }
      JS_FreeValue(ctx,JVar8);
    }
  }
  else {
    JVar9 = *local_70;
    JVar8 = *local_70;
    if (0xfffffff4 < (uint)local_70->tag) {
      *(int *)(local_70->u).ptr = *(local_70->u).ptr + 1;
      JVar8 = JVar9;
    }
LAB_0013e05f:
    errors.tag = values.tag;
    errors.u.float64 = values.u.float64;
    JVar9.tag = values.tag;
    JVar9.u.float64 = values.u.float64;
    iVar3 = JS_DefinePropertyValueUint32(ctx,JVar9,index,JVar8,7);
    if (-1 < iVar3) {
      iVar3 = remainingElementsCount_add(ctx,JVar10,-1);
      if (-1 < iVar3) {
        if (iVar3 != 0) {
          if ((magic & 3U) == 2) {
            local_40 = js_aggregate_error_constructor(ctx,errors);
            JVar8.tag = local_78;
            JVar8.u.ptr = local_80.ptr;
            if ((int)local_40.tag == 6) goto LAB_0013e11e;
            JVar10 = JS_Call(ctx,JVar8,(JSValue)(ZEXT816(3) << 0x40),1,&local_40);
            JS_FreeValue(ctx,local_40);
          }
          else {
            JVar10.tag = local_78;
            JVar10.u.ptr = local_80.ptr;
            JVar10 = JS_Call(ctx,JVar10,(JSValue)(ZEXT816(3) << 0x40),1,&values);
          }
          if ((int)JVar10.tag == 6) {
            uVar6 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
            uVar5 = (ulong)JVar10.u.ptr & 0xffffffff;
            iVar7 = JVar10.tag;
            goto LAB_0013e125;
          }
          JS_FreeValue(ctx,JVar10);
        }
        uVar5 = 0;
        uVar6 = 0;
        iVar7 = 3;
        goto LAB_0013e125;
      }
    }
  }
LAB_0013e11e:
  uVar5 = 0;
  uVar6 = 0;
LAB_0013e125:
  JVar11.u.ptr = (void *)(uVar5 | uVar6);
  JVar11.tag = iVar7;
  return JVar11;
}

Assistant:

static JSValue js_promise_all_resolve_element(JSContext *ctx,
                                              JSValueConst this_val,
                                              int argc, JSValueConst *argv,
                                              int magic,
                                              JSValue *func_data)
{
    int resolve_type = magic & 3;
    int is_reject = magic & 4;
    BOOL alreadyCalled = JS_ToBool(ctx, func_data[0]);
    JSValueConst values = func_data[2];
    JSValueConst resolve = func_data[3];
    JSValueConst resolve_element_env = func_data[4];
    JSValue ret, obj;
    int is_zero, index;
    
    if (JS_ToInt32(ctx, &index, func_data[1]))
        return JS_EXCEPTION;
    if (alreadyCalled)
        return JS_UNDEFINED;
    func_data[0] = JS_NewBool(ctx, TRUE);

    if (resolve_type == PROMISE_MAGIC_allSettled) {
        JSValue str;
        
        obj = JS_NewObject(ctx);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        str = JS_NewString(ctx, is_reject ? "rejected" : "fulfilled");
        if (JS_IsException(str))
            goto fail1;
        if (JS_DefinePropertyValue(ctx, obj, JS_ATOM_status,
                                   str,
                                   JS_PROP_C_W_E) < 0)
            goto fail1;
        if (JS_DefinePropertyValue(ctx, obj,
                                   is_reject ? JS_ATOM_reason : JS_ATOM_value,
                                   JS_DupValue(ctx, argv[0]),
                                   JS_PROP_C_W_E) < 0) {
        fail1:
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    } else {
        obj = JS_DupValue(ctx, argv[0]);
    }
    if (JS_DefinePropertyValueUint32(ctx, values, index,
                                     obj, JS_PROP_C_W_E) < 0)
        return JS_EXCEPTION;
    
    is_zero = remainingElementsCount_add(ctx, resolve_element_env, -1);
    if (is_zero < 0)
        return JS_EXCEPTION;
    if (is_zero) {
        if (resolve_type == PROMISE_MAGIC_any) {
            JSValue error;
            error = js_aggregate_error_constructor(ctx, values);
            if (JS_IsException(error))
                return JS_EXCEPTION;
            ret = JS_Call(ctx, resolve, JS_UNDEFINED, 1, (JSValueConst *)&error);
            JS_FreeValue(ctx, error);
        } else {
            ret = JS_Call(ctx, resolve, JS_UNDEFINED, 1, (JSValueConst *)&values);
        }
        if (JS_IsException(ret))
            return ret;
        JS_FreeValue(ctx, ret);
    }
    return JS_UNDEFINED;
}